

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

xmlEntityPtr xmlGetDtdEntity(xmlDocPtr doc,xmlChar *name)

{
  xmlEntitiesTablePtr table;
  xmlChar *name_local;
  xmlDocPtr doc_local;
  
  if (doc == (xmlDocPtr)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else if ((doc->extSubset == (_xmlDtd *)0x0) || (doc->extSubset->entities == (void *)0x0)) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    doc_local = (xmlDocPtr)xmlGetEntityFromTable((xmlEntitiesTablePtr)doc->extSubset->entities,name)
    ;
  }
  return (xmlEntityPtr)doc_local;
}

Assistant:

xmlEntityPtr
xmlGetDtdEntity(xmlDocPtr doc, const xmlChar *name) {
    xmlEntitiesTablePtr table;

    if (doc == NULL)
	return(NULL);
    if ((doc->extSubset != NULL) && (doc->extSubset->entities != NULL)) {
	table = (xmlEntitiesTablePtr) doc->extSubset->entities;
	return(xmlGetEntityFromTable(table, name));
    }
    return(NULL);
}